

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_types.cpp
# Opt level: O0

void duckdb::TestVectorSequence::GenerateVector
               (TestVectorInfo *info,LogicalType *type,Vector *result)

{
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  bool bVar3;
  pointer this;
  undefined8 uVar4;
  Value *in_RDX;
  LogicalType *in_RSI;
  const_iterator entry;
  list_entry_t *data;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *child_entry;
  iterator __end3;
  iterator __begin3;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *__range3;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *child_entries;
  Value *in_stack_00000190;
  idx_t in_stack_00000198;
  Vector *in_stack_000001a0;
  LogicalType *in_stack_00000488;
  Vector *in_stack_fffffffffffffe78;
  Vector *in_stack_fffffffffffffe80;
  LogicalType *type_00;
  Value *this_00;
  idx_t in_stack_fffffffffffffe98;
  int64_t in_stack_fffffffffffffea0;
  int64_t in_stack_fffffffffffffea8;
  Vector *in_stack_fffffffffffffeb0;
  allocator *paVar5;
  undefined6 in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffee8;
  NotImplementedException *in_stack_fffffffffffffef0;
  allocator local_81;
  string local_80 [32];
  _Self local_60;
  LogicalTypeId local_51;
  LogicalType local_50;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *local_38;
  __normal_iterator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
  local_30;
  Vector *local_28;
  Vector *in_stack_ffffffffffffffe0;
  Vector *result_00;
  
  LVar1 = LogicalType::id(in_RSI);
  if (((byte)(LVar1 - TINYINT) < 4) || ((byte)(LVar1 - UTINYINT) < 4)) {
    Vector::Sequence(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                     in_stack_fffffffffffffe98);
  }
  else {
    PVar2 = LogicalType::InternalType(in_RSI);
    if (PVar2 == LIST) {
      local_50.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)FlatVector::GetData<duckdb::list_entry_t>((Vector *)0x145369d);
      (local_50.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ExtraTypeInfo = (_func_int **)0x0;
      *(uint64_t *)
       &(local_50.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type = 2;
      *(undefined8 *)
       &((local_50.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->alias).
        _M_dataplus = 2;
      ((local_50.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->alias).
      _M_string_length = 0;
      ((local_50.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->alias).
      field_2._M_allocated_capacity = 2;
      *(undefined8 *)
       ((long)&((local_50.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               alias).field_2 + 8) = 1;
      ListType::GetChildType((LogicalType *)in_stack_fffffffffffffe80);
      ListVector::GetEntry((Vector *)0x1453730);
      GenerateVector((TestVectorInfo *)in_RSI,&in_RDX->type_,in_stack_ffffffffffffffe0);
      ListVector::SetListSize(in_stack_fffffffffffffe80,(idx_t)in_stack_fffffffffffffe78);
    }
    else if (PVar2 == STRUCT) {
      local_28 = (Vector *)StructVector::GetEntries(in_stack_fffffffffffffe78);
      result_00 = local_28;
      local_30._M_current =
           (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
           ::std::
           vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
           ::begin((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                    *)in_stack_fffffffffffffe78);
      local_38 = (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                 ::std::
                 vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                 ::end((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                        *)in_stack_fffffffffffffe78);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
                                 *)in_stack_fffffffffffffe80,
                                (__normal_iterator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
                                 *)in_stack_fffffffffffffe78), bVar3) {
        local_50.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             __gnu_cxx::
             __normal_iterator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
             ::operator*(&local_30);
        this = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                         ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                          in_stack_fffffffffffffe80);
        Vector::GetType(this);
        unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                  ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                   in_stack_fffffffffffffe80);
        GenerateVector((TestVectorInfo *)in_RSI,&in_RDX->type_,result_00);
        __gnu_cxx::
        __normal_iterator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
        ::operator++(&local_30);
      }
    }
    else {
      local_51 = LogicalType::id(in_RSI);
      local_50._0_8_ =
           ::std::
           map<duckdb::LogicalTypeId,_duckdb::TestType,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>_>
           ::find((map<duckdb::LogicalTypeId,_duckdb::TestType,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>_>
                   *)in_stack_fffffffffffffe78,(key_type *)0x1453790);
      local_60._M_node =
           (_Base_ptr)
           ::std::
           map<duckdb::LogicalTypeId,_duckdb::TestType,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>_>
           ::end((map<duckdb::LogicalTypeId,_duckdb::TestType,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>_>
                  *)in_stack_fffffffffffffe78);
      bVar3 = ::std::operator==((_Self *)&local_50,&local_60);
      if (bVar3) {
        uVar4 = __cxa_allocate_exception(0x10);
        paVar5 = &local_81;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_80,"Unimplemented type for test_vector_types %s",paVar5);
        LogicalType::ToString_abi_cxx11_(in_stack_00000488);
        NotImplementedException::NotImplementedException<std::__cxx11::string>
                  (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(LVar1,CONCAT16(PVar2,in_stack_fffffffffffffee0)));
        __cxa_throw(uVar4,&NotImplementedException::typeinfo,
                    NotImplementedException::~NotImplementedException);
      }
      type_00 = &local_50;
      this_00 = in_RDX;
      ::std::_Rb_tree_const_iterator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>::
      operator->((_Rb_tree_const_iterator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>
                  *)0x145390c);
      Vector::SetValue(in_stack_000001a0,in_stack_00000198,in_stack_00000190);
      ::std::_Rb_tree_const_iterator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>::
      operator->((_Rb_tree_const_iterator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>
                  *)0x1453938);
      Vector::SetValue(in_stack_000001a0,in_stack_00000198,in_stack_00000190);
      LogicalType::LogicalType(&in_RDX->type_,(LogicalType *)in_stack_fffffffffffffe78);
      Value::Value(this_00,type_00);
      Vector::SetValue(in_stack_000001a0,in_stack_00000198,in_stack_00000190);
      Value::~Value(in_RDX);
      LogicalType::~LogicalType((LogicalType *)0x14539b6);
    }
  }
  return;
}

Assistant:

static void GenerateVector(TestVectorInfo &info, const LogicalType &type, Vector &result) {
		D_ASSERT(type == result.GetType());
		switch (type.id()) {
		case LogicalTypeId::TINYINT:
		case LogicalTypeId::SMALLINT:
		case LogicalTypeId::INTEGER:
		case LogicalTypeId::BIGINT:
		case LogicalTypeId::UTINYINT:
		case LogicalTypeId::USMALLINT:
		case LogicalTypeId::UINTEGER:
		case LogicalTypeId::UBIGINT:
			result.Sequence(3, 2, 3);
#if STANDARD_VECTOR_SIZE <= 2
			result.Flatten(3);
#endif
			return;
		default:
			break;
		}
		switch (type.InternalType()) {
		case PhysicalType::STRUCT: {
			auto &child_entries = StructVector::GetEntries(result);
			for (auto &child_entry : child_entries) {
				GenerateVector(info, child_entry->GetType(), *child_entry);
			}
			break;
		}
		case PhysicalType::LIST: {
			D_ASSERT(type.id() != LogicalTypeId::MAP);
			auto data = FlatVector::GetData<list_entry_t>(result);
			data[0].offset = 0;
			data[0].length = 2;
			data[1].offset = 2;
			data[1].length = 0;
			data[2].offset = 2;
			data[2].length = 1;

			GenerateVector(info, ListType::GetChildType(type), ListVector::GetEntry(result));
			ListVector::SetListSize(result, 3);
			break;
		}
		default: {
			auto entry = info.test_type_map.find(type.id());
			if (entry == info.test_type_map.end()) {
				throw NotImplementedException("Unimplemented type for test_vector_types %s", type.ToString());
			}
			result.SetValue(0, entry->second.min_value);
			result.SetValue(1, entry->second.max_value);
			result.SetValue(2, Value(type));
			break;
		}
		}
	}